

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

char * cp_enumerate(wchar_t index)

{
  int iVar1;
  wchar_t charset;
  wchar_t index_local;
  
  iVar1 = charset_localenc_nth(index);
  if (iVar1 == 0) {
    iVar1 = charset_localenc_nth(index + L'\xffffffff');
    if (iVar1 == 0) {
      _charset = (char *)0x0;
    }
    else {
      _charset = "Use font encoding";
    }
  }
  else {
    _charset = charset_to_localenc(iVar1);
  }
  return _charset;
}

Assistant:

const char *cp_enumerate(int index)
{
    int charset;
    charset = charset_localenc_nth(index);
    if (charset == CS_NONE) {
        /* "Use font encoding" comes after all the named charsets */
        if (charset_localenc_nth(index-1) != CS_NONE)
            return "Use font encoding";
        return NULL;
    }
    return charset_to_localenc(charset);
}